

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cookie.c
# Opt level: O1

Cookie * Curl_cookie_add(Curl_easy *data,CookieInfo *c,_Bool httpheader,_Bool noexpire,char *lineptr
                        ,char *domain,char *path,_Bool secure)

{
  char cVar1;
  char cVar2;
  bool bVar3;
  uint uVar4;
  _Bool _Var5;
  _Bool _Var6;
  CURLofft CVar7;
  int iVar8;
  time_t tVar9;
  Cookie *co;
  size_t sVar10;
  size_t sVar11;
  curl_off_t cVar12;
  time_t tVar13;
  char *pcVar14;
  size_t sVar15;
  Cookie *pCVar16;
  char *pcVar17;
  size_t max;
  Cookie *pCVar18;
  long lVar19;
  char *pcVar20;
  Cookie *pCVar21;
  uint uVar22;
  curl_off_t *num;
  bool bVar23;
  bool bVar24;
  bool bVar25;
  byte bVar26;
  char *local_2058;
  char name [4096];
  char what [4096];
  
  bVar26 = 0;
  tVar9 = time((time_t *)0x0);
  co = (Cookie *)(*Curl_ccalloc)(1,0x60);
  if (co == (Cookie *)0x0) {
    return (Cookie *)0x0;
  }
  if (httpheader) {
    sVar10 = strlen(lineptr);
    local_2058 = domain;
    if (sVar10 < 0x1389) {
      pcVar20 = strchr(lineptr,0x3b);
      for (; (*lineptr == '\t' || (*lineptr == ' ')); lineptr = lineptr + 1) {
      }
      bVar25 = false;
      do {
        what[0] = '\0';
        name._0_8_ = name._0_8_ & 0xffffffffffffff00;
        iVar8 = __isoc99_sscanf(lineptr,"%4095[^;\r\n=] =%4095[^;\r\n]",name,what);
        bVar24 = bVar25;
        if (0 < iVar8) {
          sVar10 = strlen(what);
          sVar11 = strlen(name);
          if (sVar11 + sVar10 < 0x1001 && (sVar10 < 0xfff && sVar11 < 0xfff)) {
            cVar2 = lineptr[sVar11];
            if ((sVar11 != 0) && ((lineptr[sVar11 - 1] == ' ' || (lineptr[sVar11 - 1] == '\t')))) {
              for (; ((cVar1 = lineptr[sVar11 - 1], cVar1 == ' ' ||
                      ((cVar1 != '\0' && (cVar1 == '\t')))) && (sVar11 != 0)); sVar11 = sVar11 - 1)
              {
              }
              name[sVar11] = '\0';
            }
            pcVar14 = what;
            for (; (sVar10 != 0 && ((name[sVar10 + 0xfff] == ' ' || (name[sVar10 + 0xfff] == '\t')))
                   ); sVar10 = sVar10 - 1) {
              name[sVar10 + 0xfff] = '\0';
            }
            for (; (*pcVar14 == ' ' || (*pcVar14 == '\t')); pcVar14 = pcVar14 + 1) {
            }
            if (co->name == (char *)0x0) {
              iVar8 = 4;
              bVar24 = true;
              if (cVar2 == '=') {
                pcVar17 = (*Curl_cstrdup)(name);
                co->name = pcVar17;
                pcVar14 = (*Curl_cstrdup)(pcVar14);
                co->value = pcVar14;
                if (pcVar14 != (char *)0x0 && co->name != (char *)0x0) goto LAB_0010e629;
              }
            }
            else if (sVar10 != 0) {
LAB_0010e42c:
              iVar8 = Curl_strcasecompare("path",name);
              if (iVar8 == 0) {
                iVar8 = Curl_strcasecompare("domain",name);
                if (iVar8 == 0) {
                  iVar8 = Curl_strcasecompare("version",name);
                  if (iVar8 == 0) {
                    iVar8 = Curl_strcasecompare("max-age",name);
                    if (iVar8 == 0) {
                      iVar8 = Curl_strcasecompare("expires",name);
                      if (iVar8 == 0) goto LAB_0010e629;
                      (*Curl_cfree)(co->expirestr);
                      pcVar14 = (*Curl_cstrdup)(pcVar14);
                      co->expirestr = pcVar14;
                    }
                    else {
                      (*Curl_cfree)(co->maxage);
                      pcVar14 = (*Curl_cstrdup)(pcVar14);
                      co->maxage = pcVar14;
                    }
                  }
                  else {
                    (*Curl_cfree)(co->version);
                    pcVar14 = (*Curl_cstrdup)(pcVar14);
                    co->version = pcVar14;
                  }
                  if (pcVar14 == (char *)0x0) goto LAB_0010e6af;
                  goto LAB_0010e629;
                }
                pcVar14 = pcVar14 + (*pcVar14 == '.');
                _Var6 = bad_domain(pcVar14);
                if (_Var6) {
                  local_2058 = ":";
                }
                pcVar17 = local_2058;
                if (local_2058 == (char *)0x0) {
                  pcVar17 = pcVar14;
                }
                _Var6 = isip(pcVar17);
                if (local_2058 == (char *)0x0) {
LAB_0010e51a:
                  (*Curl_cfree)(co->domain);
                  pcVar14 = (*Curl_cstrdup)(pcVar14);
                  co->domain = pcVar14;
                  bVar23 = pcVar14 == (char *)0x0;
                  bVar3 = !bVar23;
                  if (bVar23) {
                    bVar24 = true;
                  }
                  if (_Var6 || bVar23) {
                    iVar8 = (uint)bVar23 << 2;
                    bVar25 = bVar24;
                  }
                  else {
                    co->tailmatch = true;
                    iVar8 = 0;
                    bVar3 = true;
                  }
                }
                else {
                  if (_Var6) {
                    iVar8 = strcmp(pcVar14,local_2058);
                    if (iVar8 == 0) goto LAB_0010e51a;
                    if (!_Var6) goto LAB_0010e505;
                  }
                  else {
LAB_0010e505:
                    _Var5 = tailmatch(pcVar14,local_2058);
                    if (_Var5) goto LAB_0010e51a;
                  }
                  iVar8 = 0;
                  Curl_infof(data,"skipped cookie with bad tailmatch domain: %s\n",pcVar14);
                  bVar3 = true;
                  bVar25 = true;
                }
                bVar24 = bVar25;
                if (bVar3) goto LAB_0010e629;
              }
              else {
                (*Curl_cfree)(co->path);
                pcVar14 = (*Curl_cstrdup)(pcVar14);
                co->path = pcVar14;
                iVar8 = 4;
                bVar24 = true;
                if (pcVar14 != (char *)0x0) {
                  (*Curl_cfree)(co->spath);
                  pcVar14 = sanitize_cookie_path(co->path);
                  co->spath = pcVar14;
                  if (pcVar14 != (char *)0x0) goto LAB_0010e629;
                }
              }
            }
            else {
              iVar8 = Curl_strcasecompare("secure",name);
              if (iVar8 == 0) {
                iVar8 = Curl_strcasecompare("httponly",name);
                if (iVar8 == 0) {
                  if (cVar2 == '=') goto LAB_0010e42c;
                }
                else {
                  co->httponly = true;
                }
              }
              else {
                if ((!secure) && (c->running != false)) {
LAB_0010e6af:
                  iVar8 = 4;
                  bVar24 = true;
                  goto LAB_0010e633;
                }
                co->secure = true;
              }
LAB_0010e629:
              bVar24 = bVar25;
              iVar8 = 0;
            }
          }
          else {
            freecookie(co);
            Curl_infof(data,"oversized cookie dropped, name/val %zu + %zu bytes\n",sVar11,sVar10);
            iVar8 = 1;
          }
LAB_0010e633:
          if (iVar8 != 0) {
            if (iVar8 != 4) goto LAB_0010e72a;
            break;
          }
        }
        if ((pcVar20 == (char *)0x0) || (*pcVar20 == '\0')) {
LAB_0010e655:
          pcVar20 = (char *)0x0;
        }
        else {
          do {
            do {
              lineptr = pcVar20 + 1;
              cVar2 = *lineptr;
              pcVar20 = lineptr;
            } while (cVar2 == ' ');
          } while (cVar2 == '\t');
          pcVar20 = strchr(lineptr,0x3b);
          if (pcVar20 == (char *)0x0) {
            if (cVar2 == '\0') goto LAB_0010e655;
            sVar10 = strlen(lineptr);
            pcVar20 = lineptr + sVar10;
          }
        }
        bVar25 = bVar24;
      } while (pcVar20 != (char *)0x0);
      pcVar20 = co->maxage;
      if (pcVar20 == (char *)0x0) {
        if (co->expirestr != (char *)0x0) {
          tVar13 = curl_getdate(co->expirestr,(time_t *)0x0);
          co->expires = tVar13;
          if (tVar13 == 0) {
            co->expires = 1;
          }
          else if (tVar13 < 0) {
            co->expires = 0;
          }
        }
      }
      else {
        num = &co->expires;
        CVar7 = curlx_strtoofft(pcVar20 + (*pcVar20 == '\"'),(char **)0x0,10,num);
        if (CVar7 == CURL_OFFT_OK) {
          lVar19 = *num;
          if (lVar19 == 0) {
            *num = 1;
          }
          else {
            if (lVar19 <= 0x7fffffffffffffff - tVar9) {
              cVar12 = lVar19 + tVar9;
              goto LAB_0010e80d;
            }
            *num = 0x7fffffffffffffff;
          }
        }
        else if (CVar7 == CURL_OFFT_FLOW) {
          cVar12 = 0x7fffffffffffffff;
LAB_0010e80d:
          *num = cVar12;
        }
      }
      if (((!bVar24) && (co->domain == (char *)0x0)) && (local_2058 != (char *)0x0)) {
        pcVar20 = (*Curl_cstrdup)(local_2058);
        co->domain = pcVar20;
        bVar24 = true;
        if (pcVar20 != (char *)0x0) {
          bVar24 = false;
        }
      }
      bVar25 = bVar24;
      if (((!bVar24) && (path != (char *)0x0)) && (co->path == (char *)0x0)) {
        pcVar20 = strchr(path,0x3f);
        if (pcVar20 == (char *)0x0) {
          pcVar20 = strrchr(path,0x2f);
        }
        else {
          pcVar20 = (char *)Curl_memrchr(path,0x2f,(long)pcVar20 - (long)path);
        }
        if (pcVar20 != (char *)0x0) {
          pcVar14 = (char *)(*Curl_cmalloc)((size_t)(pcVar20 + (2 - (long)path)));
          co->path = pcVar14;
          if (pcVar14 == (char *)0x0) {
            bVar25 = true;
          }
          else {
            memcpy(pcVar14,path,(size_t)(pcVar20 + (1 - (long)path)));
            co->path[(long)(pcVar20 + (1 - (long)path))] = '\0';
            pcVar20 = sanitize_cookie_path(co->path);
            co->spath = pcVar20;
            bVar25 = true;
            if (pcVar20 != (char *)0x0) {
              bVar25 = bVar24;
            }
          }
        }
      }
      domain = local_2058;
      if ((bVar25) || (bVar25 = true, co->name == (char *)0x0)) {
        freecookie(co);
        bVar25 = false;
      }
    }
    else {
      (*Curl_cfree)(co);
LAB_0010e72a:
      bVar25 = false;
      domain = local_2058;
    }
    if (!bVar25) {
      return (Cookie *)0x0;
    }
  }
  else {
    name[0] = '\0';
    name[1] = '\0';
    name[2] = '\0';
    name[3] = '\0';
    name[4] = '\0';
    name[5] = '\0';
    name[6] = '\0';
    name[7] = '\0';
    iVar8 = strncmp(lineptr,"#HttpOnly_",10);
    if (iVar8 == 0) {
      lineptr = lineptr + 10;
      co->httponly = true;
    }
    if (*lineptr == '#') {
      (*Curl_cfree)(co);
      return (Cookie *)0x0;
    }
    pcVar20 = strchr(lineptr,0xd);
    if (pcVar20 != (char *)0x0) {
      *pcVar20 = '\0';
    }
    pcVar20 = strchr(lineptr,10);
    if (pcVar20 != (char *)0x0) {
      *pcVar20 = '\0';
    }
    pcVar20 = strtok_r(lineptr,"\t",(char **)name);
    if (pcVar20 == (char *)0x0) {
      bVar25 = false;
      uVar22 = 0;
    }
    else {
      uVar22 = 0;
      bVar24 = false;
      do {
        bVar25 = bVar24;
        switch(uVar22) {
        case 0:
          pcVar20 = (*Curl_cstrdup)(pcVar20 + (*pcVar20 == '.'));
          co->domain = pcVar20;
          uVar22 = 0;
          uVar4 = 0;
          if (pcVar20 == (char *)0x0) {
LAB_0010e202:
            uVar22 = uVar4;
            bVar25 = true;
          }
          else {
            _Var6 = bad_domain(pcVar20);
            bVar25 = true;
            if (!_Var6) {
              bVar25 = bVar24;
            }
          }
          break;
        case 1:
          iVar8 = Curl_strcasecompare(pcVar20,"TRUE");
          co->tailmatch = iVar8 != 0;
          uVar22 = 1;
          break;
        case 2:
          iVar8 = strcmp("TRUE",pcVar20);
          if ((iVar8 == 0) || (iVar8 = strcmp("FALSE",pcVar20), iVar8 == 0)) {
            pcVar14 = (*Curl_cstrdup)("/");
            co->path = pcVar14;
            pcVar17 = (*Curl_cstrdup)("/");
            if (pcVar14 == (char *)0x0) {
              bVar24 = true;
            }
            co->spath = pcVar17;
            if (pcVar17 == (char *)0x0) {
              bVar24 = true;
            }
            goto switchD_0010e034_caseD_3;
          }
          pcVar20 = (*Curl_cstrdup)(pcVar20);
          co->path = pcVar20;
          uVar22 = 2;
          uVar4 = 2;
          if (pcVar20 == (char *)0x0) goto LAB_0010e202;
          pcVar20 = sanitize_cookie_path(pcVar20);
          co->spath = pcVar20;
          if (pcVar20 == (char *)0x0) {
            bVar25 = true;
          }
          break;
        case 3:
switchD_0010e034_caseD_3:
          co->secure = false;
          iVar8 = Curl_strcasecompare(pcVar20,"TRUE");
          uVar22 = 3;
          bVar25 = bVar24;
          if (iVar8 != 0) {
            if ((!secure) && (uVar4 = 3, c->running != true)) goto LAB_0010e202;
            co->secure = true;
          }
          break;
        case 4:
          CVar7 = curlx_strtoofft(pcVar20,(char **)0x0,10,&co->expires);
          if (CVar7 != CURL_OFFT_OK) {
            bVar24 = true;
          }
          uVar22 = 4;
          bVar25 = bVar24;
          break;
        case 5:
          pcVar20 = (*Curl_cstrdup)(pcVar20);
          co->name = pcVar20;
          if (pcVar20 == (char *)0x0) {
            bVar24 = true;
          }
          uVar22 = 5;
          bVar25 = bVar24;
          break;
        case 6:
          pcVar20 = (*Curl_cstrdup)(pcVar20);
          co->value = pcVar20;
          if (pcVar20 == (char *)0x0) {
            bVar24 = true;
          }
          uVar22 = 6;
          bVar25 = bVar24;
        }
        pcVar20 = strtok_r((char *)0x0,"\t",(char **)name);
        uVar22 = uVar22 + 1;
      } while ((pcVar20 != (char *)0x0) && (bVar24 = bVar25, !bVar25));
    }
    if (uVar22 == 6) {
      pcVar20 = (*Curl_cstrdup)("");
      co->value = pcVar20;
      bVar24 = true;
      if (pcVar20 != (char *)0x0) {
        bVar24 = bVar25;
      }
      bVar25 = bVar24;
      uVar22 = pcVar20 == (char *)0x0 ^ 7;
    }
    if ((bVar25) || (uVar22 != 7)) goto LAB_0010eae6;
  }
  if (((c->running != false) || (c->newsession != true)) || (co->expires != 0)) {
    co->livecookie = c->running;
    iVar8 = c->lastct + 1;
    c->lastct = iVar8;
    co->creationtime = iVar8;
    if (!noexpire) {
      remove_expired(c);
    }
    if (((domain != (char *)0x0) && (co->domain != (char *)0x0)) &&
       ((_Var6 = isip(co->domain), !_Var6 && (_Var6 = bad_domain(co->domain), _Var6)))) {
      Curl_infof(data,"cookie \'%s\' dropped, domain \'%s\' must not set cookies for \'%s\'\n",
                 co->name,domain,co->domain);
      freecookie(co);
      return (Cookie *)0x0;
    }
    sVar15 = cookiehash(co->domain);
    if (c->cookies[sVar15] == (Cookie *)0x0) {
      bVar25 = false;
      pCVar21 = (Cookie *)0x0;
    }
    else {
      bVar25 = false;
      pCVar18 = c->cookies[sVar15];
      do {
        pCVar16 = pCVar18;
        iVar8 = Curl_strcasecompare(pCVar16->name,co->name);
        if (iVar8 != 0) {
          pcVar20 = pCVar16->domain;
          if (pcVar20 == (char *)0x0) {
LAB_0010ea1e:
            bVar24 = co->domain == (char *)0x0;
LAB_0010ea23:
            if (bVar24) {
              bVar25 = true;
            }
          }
          else if (co->domain == (char *)0x0) {
            if (pcVar20 == (char *)0x0) goto LAB_0010ea1e;
          }
          else {
            iVar8 = Curl_strcasecompare(pcVar20,co->domain);
            if (iVar8 != 0) {
              bVar24 = pCVar16->tailmatch == co->tailmatch;
              goto LAB_0010ea23;
            }
          }
          if (bVar25) {
            pcVar20 = pCVar16->spath;
            if (pcVar20 == (char *)0x0) {
LAB_0010ea72:
              if (co->spath == (char *)0x0) {
                bVar25 = true;
              }
              else {
LAB_0010ea79:
                bVar25 = false;
              }
            }
            else {
              pcVar14 = co->spath;
              if (pcVar14 == (char *)0x0) {
                if (pcVar20 == (char *)0x0) goto LAB_0010ea72;
                goto LAB_0010ea79;
              }
              if ((pCVar16->secure != true) || (co->secure != false || secure)) {
                iVar8 = Curl_strcasecompare(pcVar20,pcVar14);
                bVar25 = iVar8 != 0;
              }
              else {
                pcVar17 = strchr(pcVar20 + 1,0x2f);
                if (pcVar17 == (char *)0x0) {
                  max = strlen(pcVar20);
                }
                else {
                  max = (long)pcVar17 - (long)pcVar20;
                }
                iVar8 = Curl_strncasecompare(pcVar20,pcVar14,max);
                if (iVar8 != 0) goto LAB_0010eae6;
              }
            }
          }
          if (bVar25) {
            if ((co->livecookie != false) || (pCVar16->livecookie != true)) {
              co->next = pCVar16->next;
              co->creationtime = pCVar16->creationtime;
              (*Curl_cfree)(pCVar16->name);
              (*Curl_cfree)(pCVar16->value);
              (*Curl_cfree)(pCVar16->domain);
              (*Curl_cfree)(pCVar16->path);
              (*Curl_cfree)(pCVar16->spath);
              (*Curl_cfree)(pCVar16->expirestr);
              (*Curl_cfree)(pCVar16->version);
              (*Curl_cfree)(pCVar16->maxage);
              pCVar18 = co;
              pCVar21 = pCVar16;
              for (lVar19 = 0xc; lVar19 != 0; lVar19 = lVar19 + -1) {
                pCVar21->next = pCVar18->next;
                pCVar18 = (Cookie *)((long)pCVar18 + (ulong)bVar26 * -0x10 + 8);
                pCVar21 = (Cookie *)((long)pCVar21 + (ulong)bVar26 * -0x10 + 8);
              }
              (*Curl_cfree)(co);
              pCVar18 = pCVar16;
              do {
                pCVar21 = pCVar18;
                pCVar18 = pCVar21->next;
                co = pCVar16;
              } while (pCVar21->next != (Cookie *)0x0);
              break;
            }
            goto LAB_0010eae6;
          }
        }
        pCVar18 = pCVar16->next;
        pCVar21 = pCVar16;
      } while (pCVar16->next != (Cookie *)0x0);
    }
    if (c->running == true) {
      pcVar20 = "Added";
      if (bVar25) {
        pcVar20 = "Replaced";
      }
      Curl_infof(data,"%s cookie %s=\"%s\" for domain %s, path %s, expire %ld\n",pcVar20,co->name,
                 co->value,co->domain,co->path,co->expires);
    }
    if (!bVar25) {
      pCVar18 = (Cookie *)(c->cookies + sVar15);
      if (pCVar21 != (Cookie *)0x0) {
        pCVar18 = pCVar21;
      }
      pCVar18->next = co;
      c->numcookies = c->numcookies + 1;
      return co;
    }
    return co;
  }
LAB_0010eae6:
  freecookie(co);
  return (Cookie *)0x0;
}

Assistant:

struct Cookie *
Curl_cookie_add(struct Curl_easy *data,
                /* The 'data' pointer here may be NULL at times, and thus
                   must only be used very carefully for things that can deal
                   with data being NULL. Such as infof() and similar */

                struct CookieInfo *c,
                bool httpheader, /* TRUE if HTTP header-style line */
                bool noexpire, /* if TRUE, skip remove_expired() */
                char *lineptr,   /* first character of the line */
                const char *domain, /* default domain */
                const char *path,   /* full path used when this cookie is set,
                                       used to get default path for the cookie
                                       unless set */
                bool secure)  /* TRUE if connection is over secure origin */
{
  struct Cookie *clist;
  struct Cookie *co;
  struct Cookie *lastc = NULL;
  time_t now = time(NULL);
  bool replace_old = FALSE;
  bool badcookie = FALSE; /* cookies are good by default. mmmmm yummy */
  size_t myhash;

#ifdef CURL_DISABLE_VERBOSE_STRINGS
  (void)data;
#endif

  /* First, alloc and init a new struct for it */
  co = calloc(1, sizeof(struct Cookie));
  if(!co)
    return NULL; /* bail out if we're this low on memory */

  if(httpheader) {
    /* This line was read off a HTTP-header */
    char name[MAX_NAME];
    char what[MAX_NAME];
    const char *ptr;
    const char *semiptr;

    size_t linelength = strlen(lineptr);
    if(linelength > MAX_COOKIE_LINE) {
      /* discard overly long lines at once */
      free(co);
      return NULL;
    }

    semiptr = strchr(lineptr, ';'); /* first, find a semicolon */

    while(*lineptr && ISBLANK(*lineptr))
      lineptr++;

    ptr = lineptr;
    do {
      /* we have a <what>=<this> pair or a stand-alone word here */
      name[0] = what[0] = 0; /* init the buffers */
      if(1 <= sscanf(ptr, "%" MAX_NAME_TXT "[^;\r\n=] =%"
                     MAX_NAME_TXT "[^;\r\n]",
                     name, what)) {
        /* Use strstore() below to properly deal with received cookie
           headers that have the same string property set more than once,
           and then we use the last one. */
        const char *whatptr;
        bool done = FALSE;
        bool sep;
        size_t len = strlen(what);
        size_t nlen = strlen(name);
        const char *endofn = &ptr[ nlen ];

        if(nlen >= (MAX_NAME-1) || len >= (MAX_NAME-1) ||
           ((nlen + len) > MAX_NAME)) {
          /* too long individual name or contents, or too long combination of
             name + contents. Chrome and Firefox support 4095 or 4096 bytes
             combo. */
          freecookie(co);
          infof(data, "oversized cookie dropped, name/val %zu + %zu bytes\n",
                nlen, len);
          return NULL;
        }

        /* name ends with a '=' ? */
        sep = (*endofn == '=')?TRUE:FALSE;

        if(nlen) {
          endofn--; /* move to the last character */
          if(ISBLANK(*endofn)) {
            /* skip trailing spaces in name */
            while(*endofn && ISBLANK(*endofn) && nlen) {
              endofn--;
              nlen--;
            }
            name[nlen] = 0; /* new end of name */
          }
        }

        /* Strip off trailing whitespace from the 'what' */
        while(len && ISBLANK(what[len-1])) {
          what[len-1] = 0;
          len--;
        }

        /* Skip leading whitespace from the 'what' */
        whatptr = what;
        while(*whatptr && ISBLANK(*whatptr))
          whatptr++;

        if(!co->name) {
          /* The very first name/value pair is the actual cookie name */
          if(!sep) {
            /* Bad name/value pair. */
            badcookie = TRUE;
            break;
          }
          co->name = strdup(name);
          co->value = strdup(whatptr);
          done = TRUE;
          if(!co->name || !co->value) {
            badcookie = TRUE;
            break;
          }
        }
        else if(!len) {
          /* this was a "<name>=" with no content, and we must allow
             'secure' and 'httponly' specified this weirdly */
          done = TRUE;
          /*
           * secure cookies are only allowed to be set when the connection is
           * using a secure protocol, or when the cookie is being set by
           * reading from file
           */
          if(strcasecompare("secure", name)) {
            if(secure || !c->running) {
              co->secure = TRUE;
            }
            else {
              badcookie = TRUE;
              break;
            }
          }
          else if(strcasecompare("httponly", name))
            co->httponly = TRUE;
          else if(sep)
            /* there was a '=' so we're not done parsing this field */
            done = FALSE;
        }
        if(done)
          ;
        else if(strcasecompare("path", name)) {
          strstore(&co->path, whatptr);
          if(!co->path) {
            badcookie = TRUE; /* out of memory bad */
            break;
          }
          free(co->spath); /* if this is set again */
          co->spath = sanitize_cookie_path(co->path);
          if(!co->spath) {
            badcookie = TRUE; /* out of memory bad */
            break;
          }
        }
        else if(strcasecompare("domain", name)) {
          bool is_ip;

          /* Now, we make sure that our host is within the given domain,
             or the given domain is not valid and thus cannot be set. */

          if('.' == whatptr[0])
            whatptr++; /* ignore preceding dot */

#ifndef USE_LIBPSL
          /*
           * Without PSL we don't know when the incoming cookie is set on a
           * TLD or otherwise "protected" suffix. To reduce risk, we require a
           * dot OR the exact host name being "localhost".
           */
          if(bad_domain(whatptr))
            domain = ":";
#endif

          is_ip = isip(domain ? domain : whatptr);

          if(!domain
             || (is_ip && !strcmp(whatptr, domain))
             || (!is_ip && tailmatch(whatptr, domain))) {
            strstore(&co->domain, whatptr);
            if(!co->domain) {
              badcookie = TRUE;
              break;
            }
            if(!is_ip)
              co->tailmatch = TRUE; /* we always do that if the domain name was
                                       given */
          }
          else {
            /* we did not get a tailmatch and then the attempted set domain
               is not a domain to which the current host belongs. Mark as
               bad. */
            badcookie = TRUE;
            infof(data, "skipped cookie with bad tailmatch domain: %s\n",
                  whatptr);
          }
        }
        else if(strcasecompare("version", name)) {
          strstore(&co->version, whatptr);
          if(!co->version) {
            badcookie = TRUE;
            break;
          }
        }
        else if(strcasecompare("max-age", name)) {
          /* Defined in RFC2109:

             Optional.  The Max-Age attribute defines the lifetime of the
             cookie, in seconds.  The delta-seconds value is a decimal non-
             negative integer.  After delta-seconds seconds elapse, the
             client should discard the cookie.  A value of zero means the
             cookie should be discarded immediately.

          */
          strstore(&co->maxage, whatptr);
          if(!co->maxage) {
            badcookie = TRUE;
            break;
          }
        }
        else if(strcasecompare("expires", name)) {
          strstore(&co->expirestr, whatptr);
          if(!co->expirestr) {
            badcookie = TRUE;
            break;
          }
        }
        /*
          else this is the second (or more) name we don't know
          about! */
      }
      else {
        /* this is an "illegal" <what>=<this> pair */
      }

      if(!semiptr || !*semiptr) {
        /* we already know there are no more cookies */
        semiptr = NULL;
        continue;
      }

      ptr = semiptr + 1;
      while(*ptr && ISBLANK(*ptr))
        ptr++;
      semiptr = strchr(ptr, ';'); /* now, find the next semicolon */

      if(!semiptr && *ptr)
        /* There are no more semicolons, but there's a final name=value pair
           coming up */
        semiptr = strchr(ptr, '\0');
    } while(semiptr);

    if(co->maxage) {
      CURLofft offt;
      offt = curlx_strtoofft((*co->maxage == '\"')?
                             &co->maxage[1]:&co->maxage[0], NULL, 10,
                             &co->expires);
      if(offt == CURL_OFFT_FLOW)
        /* overflow, used max value */
        co->expires = CURL_OFF_T_MAX;
      else if(!offt) {
        if(!co->expires)
          /* already expired */
          co->expires = 1;
        else if(CURL_OFF_T_MAX - now < co->expires)
          /* would overflow */
          co->expires = CURL_OFF_T_MAX;
        else
          co->expires += now;
      }
    }
    else if(co->expirestr) {
      /* Note that if the date couldn't get parsed for whatever reason,
         the cookie will be treated as a session cookie */
      co->expires = curl_getdate(co->expirestr, NULL);

      /* Session cookies have expires set to 0 so if we get that back
         from the date parser let's add a second to make it a
         non-session cookie */
      if(co->expires == 0)
        co->expires = 1;
      else if(co->expires < 0)
        co->expires = 0;
    }

    if(!badcookie && !co->domain) {
      if(domain) {
        /* no domain was given in the header line, set the default */
        co->domain = strdup(domain);
        if(!co->domain)
          badcookie = TRUE;
      }
    }

    if(!badcookie && !co->path && path) {
      /* No path was given in the header line, set the default.
         Note that the passed-in path to this function MAY have a '?' and
         following part that MUST not be stored as part of the path. */
      char *queryp = strchr(path, '?');

      /* queryp is where the interesting part of the path ends, so now we
         want to the find the last */
      char *endslash;
      if(!queryp)
        endslash = strrchr(path, '/');
      else
        endslash = memrchr(path, '/', (queryp - path));
      if(endslash) {
        size_t pathlen = (endslash-path + 1); /* include end slash */
        co->path = malloc(pathlen + 1); /* one extra for the zero byte */
        if(co->path) {
          memcpy(co->path, path, pathlen);
          co->path[pathlen] = 0; /* zero terminate */
          co->spath = sanitize_cookie_path(co->path);
          if(!co->spath)
            badcookie = TRUE; /* out of memory bad */
        }
        else
          badcookie = TRUE;
      }
    }

    if(badcookie || !co->name) {
      /* we didn't get a cookie name or a bad one,
         this is an illegal line, bail out */
      freecookie(co);
      return NULL;
    }

  }
  else {
    /* This line is NOT a HTTP header style line, we do offer support for
       reading the odd netscape cookies-file format here */
    char *ptr;
    char *firstptr;
    char *tok_buf = NULL;
    int fields;

    /* IE introduced HTTP-only cookies to prevent XSS attacks. Cookies
       marked with httpOnly after the domain name are not accessible
       from javascripts, but since curl does not operate at javascript
       level, we include them anyway. In Firefox's cookie files, these
       lines are preceded with #HttpOnly_ and then everything is
       as usual, so we skip 10 characters of the line..
    */
    if(strncmp(lineptr, "#HttpOnly_", 10) == 0) {
      lineptr += 10;
      co->httponly = TRUE;
    }

    if(lineptr[0]=='#') {
      /* don't even try the comments */
      free(co);
      return NULL;
    }
    /* strip off the possible end-of-line characters */
    ptr = strchr(lineptr, '\r');
    if(ptr)
      *ptr = 0; /* clear it */
    ptr = strchr(lineptr, '\n');
    if(ptr)
      *ptr = 0; /* clear it */

    firstptr = strtok_r(lineptr, "\t", &tok_buf); /* tokenize it on the TAB */

    /* Now loop through the fields and init the struct we already have
       allocated */
    for(ptr = firstptr, fields = 0; ptr && !badcookie;
        ptr = strtok_r(NULL, "\t", &tok_buf), fields++) {
      switch(fields) {
      case 0:
        if(ptr[0]=='.') /* skip preceding dots */
          ptr++;
        co->domain = strdup(ptr);
        if(!co->domain)
          badcookie = TRUE;
        else if(bad_domain(co->domain))
          badcookie = TRUE;
        break;
      case 1:
        /* This field got its explanation on the 23rd of May 2001 by
           Andr�s Garc�a:

           flag: A TRUE/FALSE value indicating if all machines within a given
           domain can access the variable. This value is set automatically by
           the browser, depending on the value you set for the domain.

           As far as I can see, it is set to true when the cookie says
           .domain.com and to false when the domain is complete www.domain.com
        */
        co->tailmatch = strcasecompare(ptr, "TRUE")?TRUE:FALSE;
        break;
      case 2:
        /* It turns out, that sometimes the file format allows the path
           field to remain not filled in, we try to detect this and work
           around it! Andr�s Garc�a made us aware of this... */
        if(strcmp("TRUE", ptr) && strcmp("FALSE", ptr)) {
          /* only if the path doesn't look like a boolean option! */
          co->path = strdup(ptr);
          if(!co->path)
            badcookie = TRUE;
          else {
            co->spath = sanitize_cookie_path(co->path);
            if(!co->spath) {
              badcookie = TRUE; /* out of memory bad */
            }
          }
          break;
        }
        /* this doesn't look like a path, make one up! */
        co->path = strdup("/");
        if(!co->path)
          badcookie = TRUE;
        co->spath = strdup("/");
        if(!co->spath)
          badcookie = TRUE;
        fields++; /* add a field and fall down to secure */
        /* FALLTHROUGH */
      case 3:
        co->secure = FALSE;
        if(strcasecompare(ptr, "TRUE")) {
          if(secure || c->running)
            co->secure = TRUE;
          else
            badcookie = TRUE;
        }
        break;
      case 4:
        if(curlx_strtoofft(ptr, NULL, 10, &co->expires))
          badcookie = TRUE;
        break;
      case 5:
        co->name = strdup(ptr);
        if(!co->name)
          badcookie = TRUE;
        break;
      case 6:
        co->value = strdup(ptr);
        if(!co->value)
          badcookie = TRUE;
        break;
      }
    }
    if(6 == fields) {
      /* we got a cookie with blank contents, fix it */
      co->value = strdup("");
      if(!co->value)
        badcookie = TRUE;
      else
        fields++;
    }

    if(!badcookie && (7 != fields))
      /* we did not find the sufficient number of fields */
      badcookie = TRUE;

    if(badcookie) {
      freecookie(co);
      return NULL;
    }

  }

  if(!c->running &&    /* read from a file */
     c->newsession &&  /* clean session cookies */
     !co->expires) {   /* this is a session cookie since it doesn't expire! */
    freecookie(co);
    return NULL;
  }

  co->livecookie = c->running;
  co->creationtime = ++c->lastct;

  /* now, we have parsed the incoming line, we must now check if this
     supersedes an already existing cookie, which it may if the previous have
     the same domain and path as this */

  /* at first, remove expired cookies */
  if(!noexpire)
    remove_expired(c);

  if(domain && co->domain && !isip(co->domain)) {
    int acceptable;
#ifdef USE_LIBPSL
    const psl_ctx_t *psl = Curl_psl_use(data);

    /* Check if the domain is a Public Suffix and if yes, ignore the cookie. */
    if(psl) {
      acceptable = psl_is_cookie_domain_acceptable(psl, domain, co->domain);
      Curl_psl_release(data);
    }
    else
#endif
    /* Without libpsl, do the best we can. */
    acceptable = !bad_domain(co->domain);

    if(!acceptable) {
      infof(data, "cookie '%s' dropped, domain '%s' must not "
                  "set cookies for '%s'\n", co->name, domain, co->domain);
      freecookie(co);
      return NULL;
    }
  }

  myhash = cookiehash(co->domain);
  clist = c->cookies[myhash];
  replace_old = FALSE;
  while(clist) {
    if(strcasecompare(clist->name, co->name)) {
      /* the names are identical */

      if(clist->domain && co->domain) {
        if(strcasecompare(clist->domain, co->domain) &&
          (clist->tailmatch == co->tailmatch))
          /* The domains are identical */
          replace_old = TRUE;
      }
      else if(!clist->domain && !co->domain)
        replace_old = TRUE;

      if(replace_old) {
        /* the domains were identical */

        if(clist->spath && co->spath) {
          if(clist->secure && !co->secure && !secure) {
            size_t cllen;
            const char *sep;

            /*
             * A non-secure cookie may not overlay an existing secure cookie.
             * For an existing cookie "a" with path "/login", refuse a new
             * cookie "a" with for example path "/login/en", while the path
             * "/loginhelper" is ok.
             */

            sep = strchr(clist->spath + 1, '/');

            if(sep)
              cllen = sep - clist->spath;
            else
              cllen = strlen(clist->spath);

            if(strncasecompare(clist->spath, co->spath, cllen)) {
              freecookie(co);
              return NULL;
            }
          }
          else if(strcasecompare(clist->spath, co->spath))
            replace_old = TRUE;
          else
            replace_old = FALSE;
        }
        else if(!clist->spath && !co->spath)
          replace_old = TRUE;
        else
          replace_old = FALSE;

      }

      if(replace_old && !co->livecookie && clist->livecookie) {
        /* Both cookies matched fine, except that the already present
           cookie is "live", which means it was set from a header, while
           the new one isn't "live" and thus only read from a file. We let
           live cookies stay alive */

        /* Free the newcomer and get out of here! */
        freecookie(co);
        return NULL;
      }

      if(replace_old) {
        co->next = clist->next; /* get the next-pointer first */

        /* when replacing, creationtime is kept from old */
        co->creationtime = clist->creationtime;

        /* then free all the old pointers */
        free(clist->name);
        free(clist->value);
        free(clist->domain);
        free(clist->path);
        free(clist->spath);
        free(clist->expirestr);
        free(clist->version);
        free(clist->maxage);

        *clist = *co;  /* then store all the new data */

        free(co);   /* free the newly alloced memory */
        co = clist; /* point to the previous struct instead */

        /* We have replaced a cookie, now skip the rest of the list but
           make sure the 'lastc' pointer is properly set */
        do {
          lastc = clist;
          clist = clist->next;
        } while(clist);
        break;
      }
    }
    lastc = clist;
    clist = clist->next;
  }

  if(c->running)
    /* Only show this when NOT reading the cookies from a file */
    infof(data, "%s cookie %s=\"%s\" for domain %s, path %s, "
          "expire %" CURL_FORMAT_CURL_OFF_T "\n",
          replace_old?"Replaced":"Added", co->name, co->value,
          co->domain, co->path, co->expires);

  if(!replace_old) {
    /* then make the last item point on this new one */
    if(lastc)
      lastc->next = co;
    else
      c->cookies[myhash] = co;
    c->numcookies++; /* one more cookie in the jar */
  }

  return co;
}